

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O1

cmCPackComponent * __thiscall
cmCPackGenerator::GetComponent(cmCPackGenerator *this,string *projectName,string *name)

{
  pointer *pppcVar1;
  char *pcVar2;
  cmCPackComponentGroup *pcVar3;
  iterator iVar4;
  undefined8 uVar5;
  pointer pbVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  const_iterator cVar10;
  long *plVar11;
  char *pcVar12;
  size_t sVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_type *psVar14;
  string *psVar15;
  pointer pcVar16;
  cmCPackComponent *pcVar17;
  string *installType;
  pointer pbVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  cmCPackComponent *component;
  string macroPrefix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  installTypesVector;
  undefined1 local_b0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  long local_80;
  size_type local_78;
  long lStack_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  cVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
           ::find(&(this->Components)._M_t,name);
  local_90._M_allocated_capacity =
       (size_type)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
       ::operator[](&this->Components,name);
  if ((_Rb_tree_header *)cVar10._M_node == &(this->Components)._M_t._M_impl.super__Rb_tree_header) {
    cmsys::SystemTools::UpperCase((string *)local_b0,name);
    plVar11 = (long *)std::__cxx11::string::replace((ulong)local_b0,0,(char *)0x0,0x4d8db0);
    local_90._8_8_ = &local_78;
    psVar14 = (size_type *)(plVar11 + 2);
    if ((size_type *)*plVar11 == psVar14) {
      local_78 = *psVar14;
      lStack_70 = plVar11[3];
    }
    else {
      local_78 = *psVar14;
      local_90._8_8_ = (size_type *)*plVar11;
    }
    local_80 = plVar11[1];
    *plVar11 = (long)psVar14;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    pcVar16 = local_b0 + 0x10;
    if ((pointer)local_b0._0_8_ != pcVar16) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    std::__cxx11::string::_M_assign((string *)local_90._M_allocated_capacity);
    local_b0._0_8_ = pcVar16;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,local_90._8_8_,local_80 + local_90._8_8_);
    std::__cxx11::string::append(local_b0);
    pcVar12 = GetOption(this,(string *)local_b0);
    if ((pointer)local_b0._0_8_ != pcVar16) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    if ((pcVar12 == (char *)0x0) || (*pcVar12 == '\0')) {
      std::__cxx11::string::_M_assign((string *)(local_90._M_allocated_capacity + 0x20));
    }
    else {
      pcVar2 = *(char **)(local_90._M_allocated_capacity + 0x28);
      psVar15 = (string *)(local_90._M_allocated_capacity + 0x20);
      strlen(pcVar12);
      std::__cxx11::string::_M_replace((ulong)psVar15,0,pcVar2,(ulong)pcVar12);
    }
    pcVar16 = local_b0 + 0x10;
    local_b0._0_8_ = pcVar16;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,local_90._8_8_,local_80 + local_90._8_8_);
    std::__cxx11::string::append(local_b0);
    pcVar12 = GetOption(this,(string *)local_b0);
    bVar7 = cmSystemTools::IsOn(pcVar12);
    *(byte *)(local_90._M_allocated_capacity + 0x48) =
         *(byte *)(local_90._M_allocated_capacity + 0x48) & 0xfd | bVar7 * '\x02';
    if ((pointer)local_b0._0_8_ != pcVar16) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    local_b0._0_8_ = pcVar16;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,local_90._8_8_,local_80 + local_90._8_8_);
    std::__cxx11::string::append(local_b0);
    pcVar12 = GetOption(this,(string *)local_b0);
    bVar7 = cmSystemTools::IsOn(pcVar12);
    *(byte *)(local_90._M_allocated_capacity + 0x48) =
         *(byte *)(local_90._M_allocated_capacity + 0x48) & 0xfe | bVar7;
    if ((pointer)local_b0._0_8_ != pcVar16) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    local_b0._0_8_ = pcVar16;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,local_90._8_8_,local_80 + local_90._8_8_);
    std::__cxx11::string::append(local_b0);
    pcVar12 = GetOption(this,(string *)local_b0);
    bVar7 = cmSystemTools::IsOn(pcVar12);
    *(byte *)(local_90._M_allocated_capacity + 0x48) =
         *(byte *)(local_90._M_allocated_capacity + 0x48) & 0xfb | bVar7 << 2;
    if ((pointer)local_b0._0_8_ != pcVar16) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    local_b0._0_8_ = pcVar16;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,local_90._8_8_,local_80 + local_90._8_8_);
    std::__cxx11::string::append(local_b0);
    pcVar12 = GetOption(this,(string *)local_b0);
    bVar7 = cmSystemTools::IsOn(pcVar12);
    if (bVar7) {
      *(byte *)(local_90._M_allocated_capacity + 0x48) =
           *(byte *)(local_90._M_allocated_capacity + 0x48) | 8;
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CPACK_DOWNLOAD_ALL","");
      pcVar12 = GetOption(this,&local_50);
      bVar8 = cmSystemTools::IsOn(pcVar12);
      *(byte *)(local_90._M_allocated_capacity + 0x48) =
           *(byte *)(local_90._M_allocated_capacity + 0x48) & 0xf7 | bVar8 << 3;
      if ((!bVar7) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2)) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if ((pointer)local_b0._0_8_ != pcVar16) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    local_b0._0_8_ = pcVar16;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,local_90._8_8_,local_80 + local_90._8_8_);
    std::__cxx11::string::append(local_b0);
    pcVar12 = GetOption(this,(string *)local_b0);
    if ((pointer)local_b0._0_8_ != pcVar16) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    if ((pcVar12 != (char *)0x0) && (*pcVar12 != '\0')) {
      pcVar2 = *(char **)(local_90._M_allocated_capacity + 0x90);
      psVar15 = (string *)(local_90._M_allocated_capacity + 0x88);
      strlen(pcVar12);
      std::__cxx11::string::_M_replace((ulong)psVar15,0,pcVar2,(ulong)pcVar12);
    }
    local_b0._0_8_ = local_b0 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,local_90._8_8_,local_80 + local_90._8_8_);
    std::__cxx11::string::append(local_b0);
    pcVar12 = GetOption(this,(string *)local_b0);
    if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    if ((pcVar12 != (char *)0x0) && (*pcVar12 != '\0')) {
      pcVar2 = *(char **)(local_90._M_allocated_capacity + 0xb0);
      psVar15 = (string *)(local_90._M_allocated_capacity + 0xa8);
      strlen(pcVar12);
      std::__cxx11::string::_M_replace((ulong)psVar15,0,pcVar2,(ulong)pcVar12);
    }
    pcVar16 = local_b0 + 0x10;
    local_b0._0_8_ = pcVar16;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,local_90._8_8_,local_80 + local_90._8_8_);
    std::__cxx11::string::append(local_b0);
    pcVar12 = GetOption(this,(string *)local_b0);
    if ((pointer)local_b0._0_8_ != pcVar16) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    if ((pcVar12 == (char *)0x0) || (*pcVar12 == '\0')) {
      *(cmCPackComponentGroup **)(local_90._M_allocated_capacity + 0x40) =
           (cmCPackComponentGroup *)0x0;
    }
    else {
      local_b0._0_8_ = pcVar16;
      sVar13 = strlen(pcVar12);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,pcVar12,pcVar12 + sVar13);
      iVar9 = (*this->_vptr_cmCPackGenerator[0x1c])(this,projectName,local_b0);
      *(cmCPackComponentGroup **)(local_90._M_allocated_capacity + 0x40) =
           (cmCPackComponentGroup *)CONCAT44(extraout_var,iVar9);
      if ((pointer)local_b0._0_8_ != pcVar16) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      pcVar3 = *(cmCPackComponentGroup **)(local_90._M_allocated_capacity + 0x40);
      iVar4._M_current =
           (pcVar3->Components).
           super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (pcVar3->Components).
          super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<cmCPackComponent*,std::allocator<cmCPackComponent*>>::
        _M_realloc_insert<cmCPackComponent*const&>
                  ((vector<cmCPackComponent*,std::allocator<cmCPackComponent*>> *)
                   &pcVar3->Components,iVar4,(cmCPackComponent **)&local_90._M_allocated_capacity);
      }
      else {
        *iVar4._M_current = (cmCPackComponent *)local_90._M_allocated_capacity;
        pppcVar1 = &(pcVar3->Components).
                    super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
      }
    }
    local_b0._0_8_ = pcVar16;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,local_90._8_8_,local_80 + local_90._8_8_);
    std::__cxx11::string::append(local_b0);
    pcVar12 = GetOption(this,(string *)local_b0);
    if ((pointer)local_b0._0_8_ != pcVar16) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    if ((pcVar12 != (char *)0x0) && (*pcVar12 != '\0')) {
      pcVar2 = *(char **)(local_90._M_allocated_capacity + 0x58);
      psVar15 = (string *)(local_90._M_allocated_capacity + 0x50);
      strlen(pcVar12);
      std::__cxx11::string::_M_replace((ulong)psVar15,0,pcVar2,(ulong)pcVar12);
    }
    pcVar16 = local_b0 + 0x10;
    local_b0._0_8_ = pcVar16;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,local_90._8_8_,local_80 + local_90._8_8_);
    std::__cxx11::string::append(local_b0);
    pcVar12 = GetOption(this,(string *)local_b0);
    if ((pointer)local_b0._0_8_ != pcVar16) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    if ((pcVar12 != (char *)0x0) && (*pcVar12 != '\0')) {
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b0._0_8_ = pcVar16;
      sVar13 = strlen(pcVar12);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,pcVar12,pcVar12 + sVar13);
      cmSystemTools::ExpandListArgument((string *)local_b0,&local_68,false);
      if ((pointer)local_b0._0_8_ != pcVar16) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      pbVar6 = local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_68.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_68.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar18 = local_68.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          uVar5 = local_90._M_allocated_capacity;
          iVar9 = (*this->_vptr_cmCPackGenerator[0x1a])(this,projectName,pbVar18);
          local_b0._0_8_ = CONCAT44(extraout_var_00,iVar9);
          std::vector<cmCPackInstallationType*,std::allocator<cmCPackInstallationType*>>::
          emplace_back<cmCPackInstallationType*>
                    ((vector<cmCPackInstallationType*,std::allocator<cmCPackInstallationType*>> *)
                     (uVar5 + 0x70),(cmCPackInstallationType **)local_b0);
          pbVar18 = pbVar18 + 1;
        } while (pbVar18 != pbVar6);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
    }
    pcVar17 = (cmCPackComponent *)(local_b0 + 0x10);
    local_b0._0_8_ = pcVar17;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,local_90._8_8_,local_80 + local_90._8_8_);
    std::__cxx11::string::append(local_b0);
    pcVar12 = GetOption(this,(string *)local_b0);
    if ((cmCPackComponent *)local_b0._0_8_ != pcVar17) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    if ((pcVar12 != (char *)0x0) && (*pcVar12 != '\0')) {
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b0._0_8_ = pcVar17;
      sVar13 = strlen(pcVar12);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,pcVar12,pcVar12 + sVar13);
      cmSystemTools::ExpandListArgument((string *)local_b0,&local_68,false);
      if ((cmCPackComponent *)local_b0._0_8_ != pcVar17) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      pbVar6 = local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_68.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_68.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar18 = local_68.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          iVar9 = (*this->_vptr_cmCPackGenerator[0x1b])(this,projectName,pbVar18);
          local_b0._0_8_ = CONCAT44(extraout_var_01,iVar9);
          iVar4._M_current = *(pointer *)(local_90._M_allocated_capacity + 0xd0);
          if (iVar4._M_current == *(pointer *)(local_90._M_allocated_capacity + 0xd8)) {
            std::vector<cmCPackComponent*,std::allocator<cmCPackComponent*>>::
            _M_realloc_insert<cmCPackComponent*const&>
                      ((vector<cmCPackComponent*,std::allocator<cmCPackComponent*>> *)
                       (local_90._M_allocated_capacity + 200),iVar4,(cmCPackComponent **)local_b0);
          }
          else {
            *iVar4._M_current = (cmCPackComponent *)local_b0._0_8_;
            *(pointer *)(local_90._M_allocated_capacity + 0xd0) =
                 *(pointer *)(local_90._M_allocated_capacity + 0xd0) + 1;
          }
          iVar4._M_current = *(pointer *)(local_b0._0_8_ + 0xe8);
          if (iVar4._M_current == *(pointer *)(local_b0._0_8_ + 0xf0)) {
            std::vector<cmCPackComponent*,std::allocator<cmCPackComponent*>>::
            _M_realloc_insert<cmCPackComponent*const&>
                      ((vector<cmCPackComponent*,std::allocator<cmCPackComponent*>> *)
                       (local_b0._0_8_ + 0xe0),iVar4,
                       (cmCPackComponent **)&local_90._M_allocated_capacity);
          }
          else {
            *iVar4._M_current = (cmCPackComponent *)local_90._M_allocated_capacity;
            *(pointer *)(local_b0._0_8_ + 0xe8) = *(pointer *)(local_b0._0_8_ + 0xe8) + 1;
          }
          pbVar18 = pbVar18 + 1;
        } while (pbVar18 != pbVar6);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
    }
    if ((size_type *)local_90._8_8_ != &local_78) {
      operator_delete((void *)local_90._8_8_,local_78 + 1);
    }
  }
  return (cmCPackComponent *)local_90._M_allocated_capacity;
}

Assistant:

cmCPackComponent* cmCPackGenerator::GetComponent(
  const std::string& projectName, const std::string& name)
{
  bool hasComponent = this->Components.count(name) != 0;
  cmCPackComponent* component = &this->Components[name];
  if (!hasComponent) {
    // Define the component
    std::string macroPrefix =
      "CPACK_COMPONENT_" + cmsys::SystemTools::UpperCase(name);
    component->Name = name;
    const char* displayName = this->GetOption(macroPrefix + "_DISPLAY_NAME");
    if (displayName && *displayName) {
      component->DisplayName = displayName;
    } else {
      component->DisplayName = component->Name;
    }
    component->IsHidden = this->IsOn(macroPrefix + "_HIDDEN");
    component->IsRequired = this->IsOn(macroPrefix + "_REQUIRED");
    component->IsDisabledByDefault = this->IsOn(macroPrefix + "_DISABLED");
    component->IsDownloaded = this->IsOn(macroPrefix + "_DOWNLOADED") ||
      cmSystemTools::IsOn(this->GetOption("CPACK_DOWNLOAD_ALL"));

    const char* archiveFile = this->GetOption(macroPrefix + "_ARCHIVE_FILE");
    if (archiveFile && *archiveFile) {
      component->ArchiveFile = archiveFile;
    }

    const char* plist = this->GetOption(macroPrefix + "_PLIST");
    if (plist && *plist) {
      component->Plist = plist;
    }

    const char* groupName = this->GetOption(macroPrefix + "_GROUP");
    if (groupName && *groupName) {
      component->Group = GetComponentGroup(projectName, groupName);
      component->Group->Components.push_back(component);
    } else {
      component->Group = nullptr;
    }

    const char* description = this->GetOption(macroPrefix + "_DESCRIPTION");
    if (description && *description) {
      component->Description = description;
    }

    // Determine the installation types.
    const char* installTypes = this->GetOption(macroPrefix + "_INSTALL_TYPES");
    if (installTypes && *installTypes) {
      std::vector<std::string> installTypesVector;
      cmSystemTools::ExpandListArgument(installTypes, installTypesVector);
      for (std::string const& installType : installTypesVector) {
        component->InstallationTypes.push_back(
          this->GetInstallationType(projectName, installType));
      }
    }

    // Determine the component dependencies.
    const char* depends = this->GetOption(macroPrefix + "_DEPENDS");
    if (depends && *depends) {
      std::vector<std::string> dependsVector;
      cmSystemTools::ExpandListArgument(depends, dependsVector);
      for (std::string const& depend : dependsVector) {
        cmCPackComponent* child = GetComponent(projectName, depend);
        component->Dependencies.push_back(child);
        child->ReverseDependencies.push_back(component);
      }
    }
  }
  return component;
}